

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

ssl_hs_wait_t bssl::ssl_get_finished(SSL_HANDSHAKE *hs)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  SSL_SESSION *session;
  size_t sVar5;
  ulong uVar6;
  Span<unsigned_char> local_d8;
  Span<const_unsigned_char> local_c8;
  Span<unsigned_char> local_b8;
  Span<const_unsigned_char> local_a8;
  byte local_91;
  size_t sStack_90;
  bool finished_ok;
  size_t finished_len;
  uint8_t finished [64];
  SSLMessage msg;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  msg.raw.len = (size_t)hs->ssl;
  bVar3 = (*((SSL *)msg.raw.len)->method->get_message)
                    ((SSL *)msg.raw.len,(SSLMessage *)(finished + 0x38));
  if (bVar3) {
    bVar3 = ssl_check_message_type((SSL *)msg.raw.len,(SSLMessage *)(finished + 0x38),0x14);
    if (bVar3) {
      session = ssl_handshake_session(hs);
      bVar3 = SSLTranscript::GetFinishedMAC
                        (&hs->transcript,(uint8_t *)&finished_len,&stack0xffffffffffffff70,session,
                         (bool)((*(byte *)(msg.raw.len + 0xa4) & 1 ^ 0xff) & 1));
      if ((bVar3) && (bVar3 = ssl_hash_message(hs,(SSLMessage *)(finished + 0x38)), bVar3)) {
        iVar4 = CBS_mem_equal((CBS *)&msg,(uint8_t *)&finished_len,sStack_90);
        local_91 = iVar4 != 0;
        iVar4 = CRYPTO_fuzzer_mode_enabled();
        uVar6 = sStack_90;
        if (iVar4 != 0) {
          local_91 = 1;
        }
        if ((local_91 & 1) == 0) {
          ssl_send_alert((SSL *)msg.raw.len,2,0x33);
          ERR_put_error(0x10,0,0x8e,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                        ,0x18c);
          hs_local._4_4_ = ssl_hs_error;
        }
        else {
          sVar5 = InplaceVector<unsigned_char,_12UL>::capacity();
          uVar2 = sStack_90;
          if ((sVar5 < uVar6) ||
             (sVar5 = InplaceVector<unsigned_char,_12UL>::capacity(), sVar5 < uVar2)) {
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                          ,0x193);
            hs_local._4_4_ = ssl_hs_error;
          }
          else {
            if ((*(byte *)(msg.raw.len + 0xa4) & 1) == 0) {
              lVar1 = *(long *)(msg.raw.len + 0x30);
              Span<unsigned_char>::Span(&local_d8,(uchar *)&finished_len,sStack_90);
              Span<unsigned_char_const>::
              Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                        ((Span<unsigned_char_const> *)&local_c8,&local_d8);
              InplaceVector<unsigned_char,_12UL>::CopyFrom
                        ((InplaceVector<unsigned_char,_12UL> *)(lVar1 + 0x1f0),local_c8);
            }
            else {
              lVar1 = *(long *)(msg.raw.len + 0x30);
              Span<unsigned_char>::Span(&local_b8,(uchar *)&finished_len,sStack_90);
              Span<unsigned_char_const>::
              Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                        ((Span<unsigned_char_const> *)&local_a8,&local_b8);
              InplaceVector<unsigned_char,_12UL>::CopyFrom
                        ((InplaceVector<unsigned_char,_12UL> *)(lVar1 + 0x1e3),local_a8);
            }
            uVar6 = (**(code **)(*(long *)msg.raw.len + 0x28))(msg.raw.len);
            if ((uVar6 & 1) == 0) {
              (**(code **)(*(long *)msg.raw.len + 0x20))(msg.raw.len);
              hs_local._4_4_ = ssl_hs_ok;
            }
            else {
              ssl_send_alert((SSL *)msg.raw.len,2,10);
              ERR_put_error(0x10,0,0xff,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                            ,0x1a0);
              hs_local._4_4_ = ssl_hs_error;
            }
          }
        }
      }
      else {
        hs_local._4_4_ = ssl_hs_error;
      }
    }
    else {
      hs_local._4_4_ = ssl_hs_error;
    }
  }
  else {
    hs_local._4_4_ = ssl_hs_read_message;
  }
  return hs_local._4_4_;
}

Assistant:

enum ssl_hs_wait_t ssl_get_finished(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (!ssl_check_message_type(ssl, msg, SSL3_MT_FINISHED)) {
    return ssl_hs_error;
  }

  // Snapshot the finished hash before incorporating the new message.
  uint8_t finished[EVP_MAX_MD_SIZE];
  size_t finished_len;
  if (!hs->transcript.GetFinishedMAC(finished, &finished_len,
                                     ssl_handshake_session(hs), !ssl->server) ||
      !ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  bool finished_ok = CBS_mem_equal(&msg.body, finished, finished_len);
  if (CRYPTO_fuzzer_mode_enabled()) {
    finished_ok = true;
  }
  if (!finished_ok) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECRYPT_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DIGEST_CHECK_FAILED);
    return ssl_hs_error;
  }

  // Copy the Finished so we can use it for renegotiation checks.
  if (finished_len > ssl->s3->previous_client_finished.capacity() ||
      finished_len > ssl->s3->previous_server_finished.capacity()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_hs_error;
  }

  if (ssl->server) {
    ssl->s3->previous_client_finished.CopyFrom(Span(finished, finished_len));
  } else {
    ssl->s3->previous_server_finished.CopyFrom(Span(finished, finished_len));
  }

  // The Finished message should be the end of a flight.
  if (ssl->method->has_unprocessed_handshake_data(ssl)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
    return ssl_hs_error;
  }

  ssl->method->next_message(ssl);
  return ssl_hs_ok;
}